

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types_method.h
# Opt level: O3

void __thiscall Am_Method_Wrapper::~Am_Method_Wrapper(Am_Method_Wrapper *this)

{
  operator_delete(this);
  return;
}

Assistant:

class _OA_DL_CLASSIMPORT Am_Method_Wrapper : public Am_Registered_Type
{
public:
  // constructor registers method's name in name registry.
  Am_Method_Wrapper(Am_ID_Tag *id_ptr, Am_Generic_Procedure *p,
                    const char *name = nullptr);
  Am_ID_Tag ID() const override { return *ID_Ptr; }
  Am_Generic_Procedure *Call;
  void Print(std::ostream &out) const override;
  virtual Am_Value From_String(const char *string) const;

protected:
  Am_ID_Tag *ID_Ptr;
}